

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<tm>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  iterator it;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *in_RSI;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  iterator in_stack_fffffffffffffd98;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  formatter<tm,_char,_void> *in_stack_fffffffffffffdb0;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_fffffffffffffdb8;
  formatter<tm,_char,_void> *in_stack_fffffffffffffdc0;
  basic_parse_context<char,_fmt::v5::internal::error_handler> local_228 [22];
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *local_10;
  
  this = local_228;
  local_10 = in_RSI;
  formatter<tm,_char,_void>::formatter(in_stack_fffffffffffffdb0);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::parse_context(local_10);
  formatter<tm,char,void>::
  parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (this,in_stack_fffffffffffffd98);
  it = formatter<tm,char,void>::
       format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 ((formatter<tm,_char,_void> *)f.tm_format._8_8_,(tm *)f.tm_format._0_8_,
                  (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                   *)parse_ctx);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to(local_10,it);
  formatter<tm,_char,_void>::~formatter((formatter<tm,_char,_void> *)0x12318d);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }